

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spvc_reflected_builtin_resource,_8UL>::reserve
          (SmallVector<spvc_reflected_builtin_resource,_8UL> *this,size_t count)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  spvc_reflected_builtin_resource *psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  spvc_reflected_builtin_resource *psVar9;
  long lVar10;
  ulong uVar11;
  
  if (count >> 0x3b == 0) {
    uVar8 = this->buffer_capacity;
    if (uVar8 < count) {
      uVar11 = 8;
      if (8 < uVar8) {
        uVar11 = uVar8;
      }
      do {
        uVar8 = uVar11;
        uVar11 = uVar8 * 2;
      } while (uVar8 < count);
      if (uVar8 < 9) {
        psVar9 = (spvc_reflected_builtin_resource *)&this->stack_storage;
      }
      else {
        psVar9 = (spvc_reflected_builtin_resource *)malloc(uVar8 << 5);
      }
      if (psVar9 == (spvc_reflected_builtin_resource *)0x0) goto LAB_001cfe80;
      if ((psVar9 != (this->super_VectorView<spvc_reflected_builtin_resource>).ptr) &&
         ((this->super_VectorView<spvc_reflected_builtin_resource>).buffer_size != 0)) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          psVar4 = (this->super_VectorView<spvc_reflected_builtin_resource>).ptr;
          puVar1 = (undefined8 *)((long)&psVar4->builtin + lVar10);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(psVar4->resource).type_id + lVar10);
          uVar7 = puVar1[1];
          puVar3 = (undefined8 *)((long)&(psVar9->resource).type_id + lVar10);
          *puVar3 = *puVar1;
          puVar3[1] = uVar7;
          pcVar2 = (char *)((long)&psVar9->builtin + lVar10);
          *(undefined8 *)pcVar2 = uVar5;
          *(undefined8 *)(pcVar2 + 8) = uVar6;
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < (this->super_VectorView<spvc_reflected_builtin_resource>).buffer_size);
      }
      psVar4 = (this->super_VectorView<spvc_reflected_builtin_resource>).ptr;
      if (psVar4 != (spvc_reflected_builtin_resource *)&this->stack_storage) {
        free(psVar4);
      }
      (this->super_VectorView<spvc_reflected_builtin_resource>).ptr = psVar9;
      this->buffer_capacity = uVar8;
    }
    return;
  }
LAB_001cfe80:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}